

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk_info.hpp
# Opt level: O3

ChunkVectorInfo * __thiscall duckdb::ChunkInfo::Cast<duckdb::ChunkVectorInfo>(ChunkInfo *this)

{
  InternalException *this_00;
  string local_40;
  
  if (this->type == VECTOR_INFO) {
    return (ChunkVectorInfo *)this;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Failed to cast chunk info to type - query result type mismatch",""
            );
  InternalException::InternalException(this_00,&local_40);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

TARGET &Cast() {
		if (type != TARGET::TYPE) {
			throw InternalException("Failed to cast chunk info to type - query result type mismatch");
		}
		return reinterpret_cast<TARGET &>(*this);
	}